

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O1

size_t DObject::StaticPointerSubstitution(DObject *old,DObject *notOld,bool scandefaults)

{
  PClassActor **ppPVar1;
  FSectorPortal *pFVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  DObject *pDVar6;
  long lVar7;
  long *plVar8;
  player_t *this;
  size_t sVar9;
  
  sVar9 = 0;
  for (plVar8 = GC::Root; ppPVar1 = PClassActor::AllActorClasses.Array, plVar8 != (long *)0x0;
      plVar8 = (long *)plVar8[2]) {
    lVar3 = (**(code **)(*plVar8 + 0x28))(plVar8,old,notOld);
    sVar9 = sVar9 + lVar3;
  }
  if ((scandefaults) && (uVar5 = (ulong)PClassActor::AllActorClasses.Count, uVar5 != 0)) {
    lVar3 = 0;
    do {
      pDVar6 = (DObject *)(*(PClass **)((long)ppPVar1 + lVar3))->Defaults;
      if (pDVar6 != (DObject *)0x0) {
        pDVar6->Class = *(PClass **)((long)ppPVar1 + lVar3);
        PointerSubstitution(pDVar6,old,notOld);
        pDVar6->Class = (PClass *)0x0;
      }
      lVar3 = lVar3 + 8;
    } while (uVar5 << 3 != lVar3);
  }
  lVar3 = 0;
  do {
    if (bodyque[lVar3] == (AActor *)old) {
      bodyque[lVar3] = (AActor *)notOld;
      sVar9 = sVar9 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  this = (player_t *)&players;
  lVar3 = 0;
  do {
    if (playeringame[lVar3] == true) {
      sVar4 = player_t::FixPointers(this,old,notOld);
      sVar9 = sVar9 + sVar4;
    }
    pFVar2 = sectorPortals.Array;
    lVar3 = lVar3 + 1;
    this = this + 1;
  } while (lVar3 != 8);
  uVar5 = (ulong)sectorPortals.Count;
  if (uVar5 != 0) {
    lVar3 = 0;
    do {
      pDVar6 = *(DObject **)((long)&(pFVar2->mSkybox).field_0 + lVar3);
      if ((pDVar6 != (DObject *)0x0) && ((pDVar6->ObjectFlags & 0x20) != 0)) {
        *(undefined8 *)((long)&(pFVar2->mSkybox).field_0 + lVar3) = 0;
        pDVar6 = (DObject *)0x0;
      }
      if (pDVar6 == old) {
        *(DObject **)((long)&(pFVar2->mSkybox).field_0 + lVar3) = notOld;
        sVar9 = sVar9 + 1;
      }
      lVar3 = lVar3 + 0x40;
    } while (uVar5 << 6 != lVar3);
  }
  if ((sectors != (sector_t_conflict *)0x0) && (0 < numsectors)) {
    lVar3 = 0;
    lVar7 = 0;
    do {
      if (*(DObject **)((long)sectors->terrainnum + lVar3 + -0x48) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar3 + -0x48) = notOld;
        sVar9 = sVar9 + 1;
      }
      if (*(DObject **)((long)sectors->Portals + lVar3 + -8) == old) {
        *(DObject **)((long)sectors->Portals + lVar3 + -8) = notOld;
        sVar9 = sVar9 + 1;
      }
      if (*(DObject **)((long)sectors->terrainnum + lVar3 + 8) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar3 + 8) = notOld;
        sVar9 = sVar9 + 1;
      }
      if (*(DObject **)((long)sectors->terrainnum + lVar3 + 0x10) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar3 + 0x10) = notOld;
        sVar9 = sVar9 + 1;
      }
      if (*(DObject **)
           ((long)&((TObjPtr<DSectorEffect> *)(sectors->interpolations + -1))->field_0 + lVar3) ==
          old) {
        *(DObject **)
         ((long)&((TObjPtr<DSectorEffect> *)(sectors->interpolations + -1))->field_0 + lVar3) =
             notOld;
        sVar9 = sVar9 + 1;
      }
      lVar7 = lVar7 + 1;
      lVar3 = lVar3 + 0x218;
    } while (lVar7 < numsectors);
  }
  if (bglobal.firstthing.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar9 = sVar9 + 1;
    bglobal.firstthing.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body1.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar9 = sVar9 + 1;
    bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body2.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar9 = sVar9 + 1;
    bglobal.body2.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  return sVar9;
}

Assistant:

size_t DObject::StaticPointerSubstitution (DObject *old, DObject *notOld, bool scandefaults)
{
	DObject *probe;
	size_t changed = 0;
	int i;

	// Go through all objects.
	i = 0;DObject *last=0;
	for (probe = GC::Root; probe != NULL; probe = probe->ObjNext)
	{
		i++;
		changed += probe->PointerSubstitution(old, notOld);
		last = probe;
	}

	if (scandefaults)
	{
		for (auto p : PClassActor::AllActorClasses)
		{
			auto def = GetDefaultByType(p);
			if (def != nullptr)
			{
				def->Class = p;
				def->DObject::PointerSubstitution(old, notOld);
				def->Class = nullptr;	// reset pointer. Defaults should not have a valid class pointer.
			}
		}
	}

	// Go through the bodyque.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		if (bodyque[i] == old)
		{
			bodyque[i] = static_cast<AActor *>(notOld);
			changed++;
		}
	}

	// Go through players.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
			changed += players[i].FixPointers (old, notOld);
	}

	for (auto &s : sectorPortals)
	{
		if (s.mSkybox == old)
		{
			s.mSkybox = static_cast<ASkyViewpoint*>(notOld);
			changed++;
		}
	}

	// Go through sectors.
	if (sectors != NULL)
	{
		for (i = 0; i < numsectors; ++i)
		{
#define SECTOR_CHECK(f,t) \
	if (sectors[i].f.p == static_cast<t *>(old)) { sectors[i].f = static_cast<t *>(notOld); changed++; }
			SECTOR_CHECK( SoundTarget, AActor );
			SECTOR_CHECK( SecActTarget, ASectorAction );
			SECTOR_CHECK( floordata, DSectorEffect );
			SECTOR_CHECK( ceilingdata, DSectorEffect );
			SECTOR_CHECK( lightingdata, DSectorEffect );
#undef SECTOR_CHECK
		}
	}

	// Go through bot stuff.
	if (bglobal.firstthing.p == (AActor *)old)		bglobal.firstthing = (AActor *)notOld, ++changed;
	if (bglobal.body1.p == (AActor *)old)			bglobal.body1 = (AActor *)notOld, ++changed;
	if (bglobal.body2.p == (AActor *)old)			bglobal.body2 = (AActor *)notOld, ++changed;

	return changed;
}